

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QList<int> * __thiscall QDockAreaLayout::indexOf(QDockAreaLayout *this,QWidget *dockWidget)

{
  bool bVar1;
  QWidget *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  int i;
  QList<int> *result;
  parameter_type in_stack_ffffffffffffffbc;
  int local_1c;
  QDockAreaLayoutInfo *this_00;
  
  local_1c = 0;
  this_00 = in_RDI;
  while( true ) {
    if (3 < local_1c) {
      memset(in_RDI,0,0x18);
      QList<int>::QList((QList<int> *)0x577397);
      return (QList<int> *)in_RDI;
    }
    ((DataPointer *)&in_RDI->sep)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->separatorWidgets).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->separatorWidgets).d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayoutInfo::indexOf(this_00,in_RSI);
    bVar1 = QList<int>::isEmpty((QList<int> *)0x577324);
    if (!bVar1) break;
    QList<int>::~QList((QList<int> *)0x57735e);
    local_1c = local_1c + 1;
  }
  QList<int>::prepend((QList<int> *)0x577336,in_stack_ffffffffffffffbc);
  return (QList<int> *)in_RDI;
}

Assistant:

QList<int> QDockAreaLayout::indexOf(const QWidget *dockWidget) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QList<int> result = docks[i].indexOf(dockWidget);
        if (!result.isEmpty()) {
            result.prepend(i);
            return result;
        }
    }
    return QList<int>();
}